

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O1

void __thiscall
pstack::Procman::FileEntries::iterator::iterator(iterator *this,FileEntries *entries,iterator pos)

{
  this->entries = entries;
  this->fetched = false;
  this->nameoff = 0;
  (this->cur).first._M_dataplus._M_p = (pointer)&(this->cur).first.field_2;
  (this->cur).first._M_string_length = 0;
  (this->cur).first.field_2._M_local_buf[0] = '\0';
  (this->cur).second.start = 0;
  (this->cur).second.end = 0;
  (this->cur).second.fileOff = 0;
  (this->entriesIterator).arrayp = pos.arrayp;
  (this->entriesIterator).idx = pos.idx;
  return;
}

Assistant:

FileEntries::iterator::iterator(const FileEntries &entries, ReaderArray<FileEntry>::iterator pos)
        : entries(entries)
        , entriesIterator(pos) {
}